

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O3

vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
* __thiscall
soul::heart::Function::getAllLocalVariables
          (vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
           *__return_storage_ptr__,Function *this)

{
  long lVar1;
  __normal_iterator<const_soul::pool_ref<soul::heart::Variable>_*,_std::vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>_>
  _Var2;
  Statement *pSVar3;
  pointer ppVar4;
  pool_ptr<soul::heart::Variable> v;
  Variable *local_48;
  pointer local_40;
  pool_ref<soul::heart::Variable> local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppVar4 = (this->blocks).
           super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_40 = (this->blocks).
             super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar4 != local_40) {
    do {
      for (pSVar3 = (ppVar4->object->statements).firstObject; pSVar3 != (Statement *)0x0;
          pSVar3 = pSVar3->nextObject) {
        lVar1 = __dynamic_cast(pSVar3,&Statement::typeinfo,&Assignment::typeinfo,0);
        if ((((lVar1 != 0) && (*(long **)(lVar1 + 0x20) != (long *)0x0)) &&
            ((**(code **)(**(long **)(lVar1 + 0x20) + 0x30))(&local_48), local_48 != (Variable *)0x0
            )) && (((external < local_48->role || ((0x19U >> (local_48->role & 0x1f) & 1) == 0)) &&
                   (_Var2 = std::
                            __find_if<__gnu_cxx::__normal_iterator<soul::pool_ref<soul::heart::Variable>const*,std::vector<soul::pool_ref<soul::heart::Variable>,std::allocator<soul::pool_ref<soul::heart::Variable>>>>,__gnu_cxx::__ops::_Iter_equals_val<soul::pool_ptr<soul::heart::Variable>const>>
                                      ((__return_storage_ptr__->
                                       super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start,
                                       (__return_storage_ptr__->
                                       super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish,&local_48),
                   _Var2._M_current ==
                   (__return_storage_ptr__->
                   super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish)))) {
          if (local_48 == (Variable *)0x0) {
            throwInternalCompilerError("object != nullptr","operator*",0x3b);
          }
          local_38.object = local_48;
          std::
          vector<soul::pool_ref<soul::heart::Variable>,std::allocator<soul::pool_ref<soul::heart::Variable>>>
          ::emplace_back<soul::pool_ref<soul::heart::Variable>>
                    ((vector<soul::pool_ref<soul::heart::Variable>,std::allocator<soul::pool_ref<soul::heart::Variable>>>
                      *)__return_storage_ptr__,&local_38);
        }
      }
      ppVar4 = ppVar4 + 1;
    } while (ppVar4 != local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<pool_ref<Variable>> getAllLocalVariables() const
        {
            std::vector<pool_ref<Variable>> locals;

            for (auto& b : blocks)
                for (auto s : b->statements)
                    if (auto a = cast<const Assignment> (*s))
                        if (a->target != nullptr)
                            if (auto v = a->target->getRootVariable())
                                if (! (v->isParameter() || v->isState() || contains (locals, v)))
                                    locals.push_back (*v);

            return locals;
        }